

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O1

void duckdb::HistogramBinFinalizeFunction<duckdb::HistogramStringFunctor,duckdb::string_t>
               (Vector *state_vector,AggregateInputData *param_2,Vector *result,idx_t count,
               idx_t offset)

{
  ulong uVar1;
  ulong *puVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar5;
  undefined8 uVar6;
  element_type *peVar7;
  bool bVar8;
  LogicalType *type;
  Vector *this_00;
  Vector *pVVar9;
  ulong uVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  idx_t iVar12;
  data_ptr_t pdVar13;
  long *plVar14;
  idx_t iVar15;
  ulong uVar16;
  long lVar17;
  data_ptr_t pdVar18;
  long lVar19;
  string_t sVar20;
  UnifiedVectorFormat sdata;
  data_ptr_t local_120;
  idx_t local_c8;
  UnifiedVectorFormat local_c0;
  Value local_78;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&local_c0);
  Vector::ToUnifiedFormat(state_vector,count,&local_c0);
  FlatVector::VerifyFlatVector(result);
  local_120 = (data_ptr_t)ListVector::GetListSize(result);
  type = MapType::KeyType(&result->type);
  bVar8 = SupportsOtherBucket(type);
  if (count == 0) {
    lVar17 = 0;
  }
  else {
    lVar17 = 0;
    iVar12 = 0;
    do {
      iVar15 = iVar12;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        iVar15 = (idx_t)(local_c0.sel)->sel_vector[iVar12];
      }
      plVar14 = (long *)**(long **)(local_c0.data + iVar15 * 8);
      if (plVar14 != (long *)0x0) {
        lVar17 = (ulong)(*(long *)(*(long *)((*(long **)(local_c0.data + iVar15 * 8))[1] + 8) + -8)
                         != 0 && bVar8) + (plVar14[1] - *plVar14 >> 4) + lVar17;
      }
      iVar12 = iVar12 + 1;
    } while (count != iVar12);
  }
  ListVector::Reserve(result,(idx_t)(local_120 + lVar17));
  this_00 = MapVector::GetKeys(result);
  pVVar9 = MapVector::GetValues(result);
  if (count != 0) {
    pdVar3 = result->data;
    pdVar4 = pVVar9->data;
    uVar16 = 0;
    do {
      uVar10 = uVar16;
      if ((local_c0.sel)->sel_vector != (sel_t *)0x0) {
        uVar10 = (ulong)(local_c0.sel)->sel_vector[uVar16];
      }
      uVar1 = uVar16 + offset;
      plVar14 = *(long **)(local_c0.data + uVar10 * 8);
      if (*plVar14 == 0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_c8 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_78,&local_c8);
          peVar7 = local_78.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          uVar6 = local_78.type_._0_8_;
          local_78.type_._0_8_ = (element_type *)0x0;
          local_78.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar6;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar7;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (local_78.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_78.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar11->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar5 = (byte)uVar1 & 0x3f;
        puVar2 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar1 >> 6);
        *puVar2 = *puVar2 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      }
      else {
        *(data_ptr_t *)(pdVar3 + uVar1 * 0x10) = local_120;
        lVar17 = *(long *)*plVar14;
        if (((long *)*plVar14)[1] != lVar17) {
          lVar19 = 1;
          pdVar18 = (data_ptr_t)0x0;
          pdVar13 = pdVar4;
          do {
            sVar20.value.pointer.ptr = (char *)pdVar13;
            sVar20.value._0_8_ = *(undefined8 *)(lVar17 + lVar19 * 8);
            sVar20 = StringVector::AddStringOrBlob
                               ((StringVector *)this_00,*(Vector **)(lVar17 + -8 + lVar19 * 8),
                                sVar20);
            pdVar13 = this_00->data;
            *(long *)(pdVar13 + lVar19 * 8 + (long)local_120 * 0x10 + -8) = sVar20.value._0_8_;
            *(long *)(pdVar13 + lVar19 * 8 + (long)local_120 * 0x10) = sVar20.value._8_8_;
            *(undefined8 *)(pdVar4 + (long)pdVar18 * 8 + (long)local_120 * 8) =
                 *(undefined8 *)(*(long *)plVar14[1] + (long)pdVar18 * 8);
            pdVar18 = pdVar18 + 1;
            lVar17 = *(long *)*plVar14;
            pdVar13 = (data_ptr_t)(((long *)*plVar14)[1] - lVar17 >> 4);
            lVar19 = lVar19 + 2;
          } while (pdVar18 < pdVar13);
          local_120 = local_120 + (long)pdVar18;
        }
        if (bVar8 && *(long *)(*(long *)(plVar14[1] + 8) + -8) != 0) {
          OtherBucketValue(&local_78,&this_00->type);
          Vector::SetValue(this_00,(idx_t)local_120,&local_78);
          Value::~Value(&local_78);
          *(undefined8 *)(pdVar4 + (long)local_120 * 8) =
               *(undefined8 *)(*(long *)(plVar14[1] + 8) + -8);
          local_120 = local_120 + 1;
        }
        plVar14 = (long *)(pdVar3 + uVar1 * 0x10);
        plVar14[1] = (long)local_120 - *plVar14;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 != count);
  }
  ListVector::SetListSize(result,(idx_t)local_120);
  Vector::Verify(result,count);
  if (local_c0.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void HistogramBinFinalizeFunction(Vector &state_vector, AggregateInputData &, Vector &result, idx_t count,
                                         idx_t offset) {
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);
	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);

	auto &mask = FlatVector::Validity(result);
	auto old_len = ListVector::GetListSize(result);
	idx_t new_entries = 0;
	bool supports_other_bucket = SupportsOtherBucket(MapType::KeyType(result.GetType()));
	// figure out how much space we need
	for (idx_t i = 0; i < count; i++) {
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			continue;
		}
		new_entries += state.bin_boundaries->size();
		if (state.counts->back() > 0 && supports_other_bucket) {
			// overflow bucket has entries
			new_entries++;
		}
	}
	// reserve space in the list vector
	ListVector::Reserve(result, old_len + new_entries);
	auto &keys = MapVector::GetKeys(result);
	auto &values = MapVector::GetValues(result);
	auto list_entries = FlatVector::GetData<list_entry_t>(result);
	auto count_entries = FlatVector::GetData<uint64_t>(values);

	idx_t current_offset = old_len;
	for (idx_t i = 0; i < count; i++) {
		const auto rid = i + offset;
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.bin_boundaries) {
			mask.SetInvalid(rid);
			continue;
		}

		auto &list_entry = list_entries[rid];
		list_entry.offset = current_offset;
		for (idx_t bin_idx = 0; bin_idx < state.bin_boundaries->size(); bin_idx++) {
			OP::template HistogramFinalize<T>((*state.bin_boundaries)[bin_idx], keys, current_offset);
			count_entries[current_offset] = (*state.counts)[bin_idx];
			current_offset++;
		}
		if (state.counts->back() > 0 && supports_other_bucket) {
			// add overflow bucket ("others")
			// set bin boundary to NULL for overflow bucket
			keys.SetValue(current_offset, OtherBucketValue(keys.GetType()));
			count_entries[current_offset] = state.counts->back();
			current_offset++;
		}
		list_entry.length = current_offset - list_entry.offset;
	}
	D_ASSERT(current_offset == old_len + new_entries);
	ListVector::SetListSize(result, current_offset);
	result.Verify(count);
}